

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-stroker.c
# Opt level: O2

PVG_FT_Error ft_stroker_outside(PVG_FT_Stroker stroker,PVG_FT_Int side,PVG_FT_Fixed line_length)

{
  long lVar1;
  PVG_FT_Stroker_LineJoin PVar2;
  PVG_FT_Error PVar3;
  ulong uVar4;
  ulong uVar5;
  PVG_FT_Long PVar6;
  PVG_FT_Long PVar7;
  PVG_FT_Long PVar8;
  PVG_FT_StrokeBorder border;
  long lVar9;
  PVG_FT_Vector *vec;
  ulong angle;
  long lVar10;
  PVG_FT_Vector local_78;
  PVG_FT_Vector sigma;
  PVG_FT_Vector local_48;
  
  PVar2 = stroker->line_join;
  if (PVar2 == PVG_FT_STROKER_LINEJOIN_ROUND) {
    PVar3 = ft_stroker_arcto(stroker,side);
    return PVar3;
  }
  uVar5 = (ulong)(uint)side;
  border = stroker->borders + uVar5;
  PVar8 = stroker->radius;
  sigma.x = 0;
  sigma.y = 0;
  lVar1 = uVar5 * -0xb40000 + 0x5a0000;
  if (PVar2 == PVG_FT_STROKER_LINEJOIN_BEVEL) {
LAB_0011e753:
    vec = &local_78;
    PVG_FT_Vector_From_Polar(vec,PVar8,lVar1 + stroker->angle_out);
    local_78.x = (stroker->center).x + local_78.x;
    local_78.y = (stroker->center).y + local_78.y;
    stroker->borders[uVar5].movable = '\0';
  }
  else {
    uVar4 = PVG_FT_Angle_Diff(stroker->angle_in,stroker->angle_out);
    angle = uVar5 * 0xb40000 - 0x5a0000;
    if ((uVar4 & 0xfffffffffffffffe) != 0xb40000) {
      angle = (long)uVar4 / 2;
    }
    lVar9 = stroker->angle_in + lVar1 + angle;
    PVG_FT_Vector_From_Polar(&sigma,stroker->miter_limit,angle);
    if (sigma.x < 0x10000) {
      if (PVar2 != PVG_FT_STROKER_LINEJOIN_MITER) goto LAB_0011e753;
      uVar5 = -angle;
      if (0 < (long)angle) {
        uVar5 = angle;
      }
      if (uVar5 < 0x3a) goto LAB_0011e90b;
      PVar6 = PVG_FT_MulFix(PVar8,stroker->miter_limit);
      PVG_FT_Vector_From_Polar(&local_78,PVar6,lVar9);
      PVar6 = PVG_FT_DivFix(0x10000 - sigma.x,sigma.y);
      PVar7 = PVG_FT_MulFix(local_78.y,PVar6);
      PVar6 = PVG_FT_MulFix(-local_78.x,PVar6);
      local_78.x = (stroker->center).x + local_78.x;
      local_78.y = (stroker->center).y + local_78.y;
      lVar9 = PVar7 + local_78.x;
      lVar10 = PVar6 + local_78.y;
      local_48.x = lVar9;
      local_48.y = lVar10;
      ft_stroke_border_lineto(border,&local_48,'\0');
      local_48.x = local_78.x * 2 - lVar9;
      local_48.y = local_78.y * 2 - lVar10;
      PVar3 = ft_stroke_border_lineto(border,&local_48,'\0');
      if (line_length != 0) {
        return PVar3;
      }
      lVar9 = stroker->angle_out;
      vec = &local_48;
    }
    else {
LAB_0011e90b:
      PVar8 = PVG_FT_MulDiv(stroker->radius,stroker->miter_limit,sigma.x);
      PVG_FT_Vector_From_Polar(&local_78,PVar8,lVar9);
      local_78.x = (stroker->center).x + local_78.x;
      local_78.y = (stroker->center).y + local_78.y;
      PVar3 = ft_stroke_border_lineto(border,&local_78,'\0');
      if (line_length != 0) {
        return PVar3;
      }
      PVar8 = stroker->radius;
      lVar9 = stroker->angle_out;
      vec = &local_78;
    }
    PVG_FT_Vector_From_Polar(vec,PVar8,lVar1 + lVar9);
    lVar1 = (stroker->center).y;
    vec->x = (stroker->center).x + vec->x;
    vec->y = lVar1 + vec->y;
  }
  PVar3 = ft_stroke_border_lineto(border,vec,'\0');
  return PVar3;
}

Assistant:

static PVG_FT_Error
ft_stroker_outside( PVG_FT_Stroker  stroker,
                    PVG_FT_Int      side,
                    PVG_FT_Fixed    line_length )
{
    PVG_FT_StrokeBorder  border = stroker->borders + side;
    PVG_FT_Error         error;
    PVG_FT_Angle         rotate;


    if ( stroker->line_join == PVG_FT_STROKER_LINEJOIN_ROUND )
      error = ft_stroker_arcto( stroker, side );
    else
    {
      /* this is a mitered (pointed) or beveled (truncated) corner */
      PVG_FT_Fixed   radius = stroker->radius;
      PVG_FT_Vector  sigma = {0, 0};
      PVG_FT_Angle   theta = 0, phi = 0;
      PVG_FT_Bool    bevel, fixed_bevel;


      rotate = PVG_FT_SIDE_TO_ROTATE( side );

      bevel =
        PVG_FT_BOOL( stroker->line_join == PVG_FT_STROKER_LINEJOIN_BEVEL );

      fixed_bevel =
        PVG_FT_BOOL( stroker->line_join != PVG_FT_STROKER_LINEJOIN_MITER_VARIABLE );

      /* check miter limit first */
      if ( !bevel )
      {
        theta = PVG_FT_Angle_Diff( stroker->angle_in, stroker->angle_out ) / 2;

        if ( theta == PVG_FT_ANGLE_PI2 )
          theta = -rotate;

        phi    = stroker->angle_in + theta + rotate;

        PVG_FT_Vector_From_Polar( &sigma, stroker->miter_limit, theta );

        /* is miter limit exceeded? */
        if ( sigma.x < 0x10000L )
        {
          /* don't create variable bevels for very small deviations; */
          /* FT_Sin(x) = 0 for x <= 57                               */
          if ( fixed_bevel || ft_pos_abs( theta ) > 57 )
            bevel = TRUE;
        }
      }

      if ( bevel )  /* this is a bevel (broken angle) */
      {
        if ( fixed_bevel )
        {
          /* the outer corners are simply joined together */
          PVG_FT_Vector  delta;


          /* add bevel */
          PVG_FT_Vector_From_Polar( &delta,
                                radius,
                                stroker->angle_out + rotate );
          delta.x += stroker->center.x;
          delta.y += stroker->center.y;

          border->movable = FALSE;
          error = ft_stroke_border_lineto( border, &delta, FALSE );
        }
        else /* variable bevel or clipped miter */
        {
          /* the miter is truncated */
          PVG_FT_Vector  middle, delta;
          PVG_FT_Fixed   coef;


          /* compute middle point and first angle point */
          PVG_FT_Vector_From_Polar( &middle,
                                   PVG_FT_MulFix( radius, stroker->miter_limit ),
                                   phi );

          coef    = PVG_FT_DivFix(  0x10000L - sigma.x, sigma.y );
          delta.x = PVG_FT_MulFix(  middle.y, coef );
          delta.y = PVG_FT_MulFix( -middle.x, coef );

          middle.x += stroker->center.x;
          middle.y += stroker->center.y;
          delta.x  += middle.x;
          delta.y  += middle.y;

          error = ft_stroke_border_lineto( border, &delta, FALSE );
          if ( error )
            goto Exit;

          /* compute second angle point */
          delta.x = middle.x - delta.x + middle.x;
          delta.y = middle.y - delta.y + middle.y;

          error = ft_stroke_border_lineto( border, &delta, FALSE );
          if ( error )
            goto Exit;

          /* finally, add an end point; only needed if not lineto */
          /* (line_length is zero for curves)                     */
          if ( line_length == 0 )
          {
            PVG_FT_Vector_From_Polar( &delta,
                                  radius,
                                  stroker->angle_out + rotate );

            delta.x += stroker->center.x;
            delta.y += stroker->center.y;

            error = ft_stroke_border_lineto( border, &delta, FALSE );
          }
        }
      }
      else /* this is a miter (intersection) */
      {
        PVG_FT_Fixed   length;
        PVG_FT_Vector  delta;


        length = PVG_FT_MulDiv( stroker->radius, stroker->miter_limit, sigma.x );

        PVG_FT_Vector_From_Polar( &delta, length, phi );
        delta.x += stroker->center.x;
        delta.y += stroker->center.y;

        error = ft_stroke_border_lineto( border, &delta, FALSE );
        if ( error )
          goto Exit;

        /* now add an end point; only needed if not lineto */
        /* (line_length is zero for curves)                */
        if ( line_length == 0 )
        {
          PVG_FT_Vector_From_Polar( &delta,
                                stroker->radius,
                                stroker->angle_out + rotate );
          delta.x += stroker->center.x;
          delta.y += stroker->center.y;

          error = ft_stroke_border_lineto( border, &delta, FALSE );
        }
      }
    }

  Exit:
    return error;
}